

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.h
# Opt level: O2

ptrlen make_ptrlen_startend(void *startv,void *endv)

{
  char *end;
  char *start;
  ptrlen pVar1;
  
  if (startv <= endv) {
    pVar1.len = (long)endv - (long)startv;
    pVar1.ptr = startv;
    return pVar1;
  }
  __assert_fail("end >= start",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/misc.h",0xbb,
                "ptrlen make_ptrlen_startend(const void *, const void *)");
}

Assistant:

static inline ptrlen make_ptrlen_startend(const void *startv, const void *endv)
{
    const char *start = (const char *)startv, *end = (const char *)endv;
    assert(end >= start);
    ptrlen pl;
    pl.ptr = start;
    pl.len = end - start;
    return pl;
}